

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::GetParametersTest::iterate(GetParametersTest *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  MessageBuilder *pMVar9;
  char *description;
  qpTestResult testResult;
  TestContext *this_02;
  long lVar10;
  GLuint renderbuffer;
  GLint parameter_dsa;
  GLint parameter_legacy;
  GLenum local_1ec;
  long local_1e8;
  GetParametersTest *local_1e0;
  GLchar **local_1d8;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar8;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  local_1e0 = this;
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar3) || (bVar4)) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    bVar3 = true;
    this_01 = (ostringstream *)(local_1b0 + 8);
    for (local_1e8 = 0; renderbuffer = 0, local_1e8 != 4; local_1e8 = local_1e8 + 1) {
      (**(code **)(lVar8 + 0x6e8))(1,&renderbuffer);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGenRenderbuffers has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x22ef);
      (**(code **)(lVar8 + 0xa0))(0x8d41,renderbuffer);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glBindRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x22f2);
      local_1ec = iterate::internalformats[local_1e8];
      (**(code **)(lVar8 + 0x1238))(0x8d41,local_1ec,1,2);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glRenderbufferStorage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x22f5);
      local_1d8 = iterate::pnames_strings + local_1e8;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 4) {
        parameter_legacy = 0;
        parameter_dsa = 0;
        uVar2 = *(undefined4 *)
                 ((long)GetParameterErrorsTest::PrepareObjects()::valid_parameters + lVar10);
        (**(code **)(lVar8 + 0xa30))(0x8d41,uVar2,&parameter_legacy);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glGetRenderbufferParameteriv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x230a);
        (**(code **)(lVar8 + 0x950))(renderbuffer,uVar2,&parameter_dsa);
        GVar7 = (**(code **)(lVar8 + 0x800))();
        if (GVar7 == 0) {
          if (parameter_legacy != parameter_dsa) {
            local_1b0._0_8_ = ((local_1e0->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream(this_01);
            std::operator<<((ostream *)this_01,"GetNamedRenderbufferParameteriv returned ");
            std::ostream::operator<<(this_01,parameter_dsa);
            std::operator<<((ostream *)this_01,", but ");
            std::ostream::operator<<(this_01,parameter_legacy);
            std::operator<<((ostream *)this_01," was expected for ");
            pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_1d8);
            poVar1 = &pMVar9->m_str;
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            " parameter name of renderbuffer with  internalformat = ");
            local_1d0.m_getName = glu::getInternalFormatParameterName;
            local_1d0.m_value = local_1ec;
            tcu::Format::Enum<int,_2UL>::toStream
                      (&local_1d0,&poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            ", width = 1, height = 2.");
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00b0f50e;
          }
        }
        else {
          local_1b0._0_8_ = ((local_1e0->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,
                          "GetNamedRenderbufferParameteriv unexpectedly generated ");
          local_1d0.m_getName = glu::getErrorName;
          local_1d0.m_value = GVar7;
          tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
          std::operator<<((ostream *)this_00," error when called with ");
          pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_1d8);
          poVar1 = &pMVar9->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          " parameter name of renderbuffer with  internalformat = ");
          local_1c0.m_getName = glu::getInternalFormatParameterName;
          local_1c0.m_value = local_1ec;
          tcu::Format::Enum<int,_2UL>::toStream
                    (&local_1c0,&poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          ", width = 1, height = 2.");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00b0f50e:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          bVar3 = false;
        }
      }
      (**(code **)(lVar8 + 0x460))(1,&renderbuffer);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glDeleteRenderbuffers has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x232a);
    }
    local_1e8 = 4;
    do {
      iVar5 = (**(code **)(lVar8 + 0x800))();
    } while (iVar5 != 0);
    this_02 = (local_1e0->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_02 = (local_1e0->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_02,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetParametersTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test renderbuffer. */
	glw::GLuint renderbuffer = 0;

	/* Test. */
	try
	{
		static const glw::GLenum internalformats[] = { GL_RGBA8, GL_DEPTH_COMPONENT24, GL_STENCIL_INDEX8,
													   GL_DEPTH24_STENCIL8 };

		static const glw::GLuint internalformats_count = sizeof(internalformats) / sizeof(internalformats[0]);

		for (glw::GLuint i = 0; i < internalformats_count; ++i)
		{
			gl.genRenderbuffers(1, &renderbuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

			gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

			gl.renderbufferStorage(GL_RENDERBUFFER, internalformats[i], 1, 2);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

			static const glw::GLenum pnames[] = { GL_RENDERBUFFER_WIDTH,		   GL_RENDERBUFFER_HEIGHT,
												  GL_RENDERBUFFER_INTERNAL_FORMAT, GL_RENDERBUFFER_SAMPLES,
												  GL_RENDERBUFFER_RED_SIZE,		   GL_RENDERBUFFER_GREEN_SIZE,
												  GL_RENDERBUFFER_BLUE_SIZE,	   GL_RENDERBUFFER_ALPHA_SIZE,
												  GL_RENDERBUFFER_DEPTH_SIZE,	  GL_RENDERBUFFER_STENCIL_SIZE };

			static const glw::GLchar* pnames_strings[] = {
				"GL_RENDERBUFFER_WIDTH",	   "GL_RENDERBUFFER_HEIGHT",	 "GL_RENDERBUFFER_INTERNAL_FORMAT",
				"GL_RENDERBUFFER_SAMPLES",	 "GL_RENDERBUFFER_RED_SIZE",   "GL_RENDERBUFFER_GREEN_SIZE",
				"GL_RENDERBUFFER_BLUE_SIZE",   "GL_RENDERBUFFER_ALPHA_SIZE", "GL_RENDERBUFFER_DEPTH_SIZE",
				"GL_RENDERBUFFER_STENCIL_SIZE"
			};

			for (glw::GLuint j = 0; j < internalformats_count; ++j)
			{
				glw::GLint parameter_legacy = 0;
				glw::GLint parameter_dsa	= 0;

				gl.getRenderbufferParameteriv(GL_RENDERBUFFER, pnames[j], &parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetRenderbufferParameteriv has failed");

				gl.getNamedRenderbufferParameteriv(renderbuffer, pnames[j], &parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedRenderbufferParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << pnames_strings[i]
						<< " parameter name of renderbuffer with  internalformat = "
						<< glu::getInternalFormatParameterStr(internalformats[i]) << ", width = 1, height = 2."
						<< tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (parameter_legacy != parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedRenderbufferParameteriv returned " << parameter_dsa
						<< ", but " << parameter_legacy << " was expected for " << pnames_strings[i]
						<< " parameter name of renderbuffer with  internalformat = "
						<< glu::getInternalFormatParameterStr(internalformats[i]) << ", width = 1, height = 2."
						<< tcu::TestLog::EndMessage;

					is_ok = false;
				}
			}

			gl.deleteRenderbuffers(1, &renderbuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteRenderbuffers has failed");

			renderbuffer = 0;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (renderbuffer)
	{
		gl.deleteRenderbuffers(1, &renderbuffer);
	}

	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}